

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDVertex::GetBoundaryVertexEdgeIndices(ON_SubDVertex *this,uint *vei0,uint *vei1)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  uint vbi [2];
  
  vbi[0] = 0;
  vbi[1] = 0;
  uVar1 = this->m_edge_count;
  uVar5 = 0;
  if ((ulong)uVar1 != 0) {
    pOVar2 = this->m_edges;
    lVar6 = 0;
    do {
      uVar4 = (uint)uVar5;
      if (*(short *)((pOVar2[lVar6].m_ptr & 0xfffffffffffffff8) + 100) == 1) {
        bVar7 = true;
        uVar3 = 0;
        if (uVar4 < 2) {
          uVar4 = uVar4 + 1;
          vbi[uVar5] = (uint)lVar6;
          goto LAB_005d2c7b;
        }
      }
      else {
LAB_005d2c7b:
        bVar7 = false;
        uVar3 = (ulong)uVar4;
      }
      uVar5 = uVar3;
    } while ((!bVar7) && (bVar7 = (ulong)uVar1 - 1 != lVar6, lVar6 = lVar6 + 1, bVar7));
    uVar5 = (ulong)((int)uVar5 == 2);
  }
  if (SUB81(uVar5,0) == false) {
    vbi[0] = 0xffffffff;
    vbi[1] = 0xffffffff;
  }
  if (vei0 != (uint *)0x0) {
    *vei0 = vbi[0];
  }
  if (vei1 != (uint *)0x0) {
    *vei1 = vbi[1];
  }
  return SUB81(uVar5,0);
}

Assistant:

bool ON_SubDVertex::GetBoundaryVertexEdgeIndices(
  unsigned* vei0,
  unsigned* vei1
) const
{
  unsigned int vbi_count = 0;
  unsigned int vbi[2] = {};
  for (unsigned short vei = 0; vei < m_edge_count; vei++)
  {
    const ON_SubDEdge* e = m_edges[vei].Edge();
    if (1 == e->m_face_count)
    {
      if (vbi_count < 2)
        vbi[vbi_count++] = vei;
      else
      {
        vbi_count = 0;
        break;
      }
    }
  }
  if (2 != vbi_count)
    vbi[0] = vbi[1] = ON_UNSET_UINT_INDEX;
  if (nullptr != vei0)
    *vei0 = vbi[0];
  if (nullptr != vei1)
    *vei1 = vbi[1];
  return (2 == vbi_count);
}